

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int ActualMain(char *filename)

{
  FrameProtector *this;
  int iVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  size_t sVar5;
  size_type *psVar6;
  long local_468;
  ifstream input;
  byte abStack_448 [488];
  long *local_260;
  ifstream prelude;
  long local_250 [2];
  byte abStack_240 [488];
  size_type *local_58;
  string prelude_file;
  FrameProtector __frame_prot;
  Sexp *activation;
  
  this = (FrameProtector *)((long)&prelude_file.field_2 + 8);
  FrameProtector::FrameProtector(this,"ActualMain");
  __frame_prot.protected_frame = (Frame *)0x0;
  FrameProtector::ProtectValue(this,(Sexp **)&__frame_prot,"activation");
  g_global_activation = GcHeap::AllocateActivation((Sexp *)0x0);
  __frame_prot.protected_frame = (Frame *)g_global_activation;
  FrameProtector::ProtectValue
            ((FrameProtector *)((long)&prelude_file.field_2 + 8),&g_global_activation,
             "g_global_activation");
  LoadBuiltins((Sexp *)__frame_prot.protected_frame);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,g_options.stdlib_path._M_dataplus._M_p,
             g_options.stdlib_path._M_dataplus._M_p + g_options.stdlib_path._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_260,_prelude,0,'\x01');
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_260);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    prelude_file._M_string_length = *psVar6;
    prelude_file.field_2._M_allocated_capacity = plVar3[3];
    local_58 = &prelude_file._M_string_length;
  }
  else {
    prelude_file._M_string_length = *psVar6;
    local_58 = (size_type *)*plVar3;
  }
  prelude_file._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  std::ifstream::ifstream(&local_260,(string *)&local_58,_S_in);
  std::ifstream::ifstream(&local_468,(string *)&g_options.input_file,_S_in);
  if ((abStack_240[local_260[-3]] & 5) == 0) {
    if ((abStack_448[*(long *)(local_468 + -0x18)] & 5) == 0) {
      iVar1 = EvalFile((ifstream *)&local_260,(Sexp *)__frame_prot.protected_frame);
      iVar2 = 1;
      if (iVar1 == 0) {
        iVar2 = EvalFile((ifstream *)&local_468,(Sexp *)__frame_prot.protected_frame);
      }
      goto LAB_0010cdca;
    }
    poVar4 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed to open file: ",0x15);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1272d8);
    }
    else {
      sVar5 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed to open prelude (",0x18);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_58,(long)prelude_file._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  iVar2 = 1;
  std::ostream::flush();
LAB_0010cdca:
  std::ifstream::~ifstream(&local_468);
  std::ifstream::~ifstream(&local_260);
  if (local_58 != &prelude_file._M_string_length) {
    operator_delete(local_58,prelude_file._M_string_length + 1);
  }
  FrameProtector::~FrameProtector((FrameProtector *)((long)&prelude_file.field_2 + 8));
  return iVar2;
}

Assistant:

int ActualMain(char *filename) {
  GC_HELPER_FRAME;
  GC_PROTECTED_LOCAL(activation);

  activation = GcHeap::AllocateActivation(nullptr);
  g_global_activation = activation;
  GC_PROTECT(g_global_activation);
  LoadBuiltins(activation);

  std::string prelude_file = g_options.stdlib_path + path_sep + "prelude.jet";
  std::ifstream prelude(prelude_file);
  std::ifstream input(g_options.input_file);

  if (prelude.fail()) {
    std::cerr << "failed to open prelude (" << prelude_file << ")" << std::endl;
    return 1;
  }

  if (input.fail()) {
    std::cerr << "failed to open file: " << filename << std::endl;
    return 1;
  }

  int exitCode = EvalFile(prelude, activation);
  if (exitCode != 0) {
    return exitCode;
  }

  return EvalFile(input, activation);
}